

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O0

longlong dyn_tbl_low_estimate(dyn_tbl_t *dyn_tbl,uchar *key_str)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> this;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> __k;
  mapped_type *pmVar2;
  void *in_RSI;
  long in_RDI;
  dyn_tbl_key_t key;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> in_stack_ffffffffffffffc8;
  undefined1 local_25 [13];
  void *local_18;
  long local_10;
  mapped_type local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_25,0,0xd);
  memcpy(local_25,local_18,(ulong)(*(uint *)(local_10 + 0x58) >> 3));
  this._M_cur = (__node_type *)
                std::
                unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
                ::find(in_stack_ffffffffffffffc8._M_cur,(key_type *)0x103b8c);
  __k._M_cur = (__node_type *)
               std::
               unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
               ::end(in_stack_ffffffffffffffc8._M_cur);
  bVar1 = std::__detail::operator!=
                    ((_Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> *)
                     &stack0xffffffffffffffd0,
                     (_Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> *)
                     &stack0xffffffffffffffc8);
  if (bVar1) {
    pmVar2 = std::
             unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
             ::operator[]((unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
                           *)this._M_cur,(key_type *)__k._M_cur);
    local_8 = *pmVar2;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

long long dyn_tbl_low_estimate(dyn_tbl_t* dyn_tbl, unsigned char* key_str) {
	dyn_tbl_key_t key;
	memset(key.key, 0, sizeof(key.key));
	memcpy(key.key, key_str, dyn_tbl->lgn / 8);

	if (dyn_tbl->array.find(key) != dyn_tbl->array.end()) {
		return dyn_tbl->array[key];
	}
	else {
		return 0;
	}
}